

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ProdItem *
slang::ast::RandSeqProductionSymbol::createProdItem(RsProdItemSyntax *syntax,ASTContext *context)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  string_view name;
  Compilation *dst;
  EVP_PKEY_CTX *src;
  ProdItem *in_RDI;
  SourceRange SVar1;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  RandSeqProductionSymbol *symbol;
  undefined1 in_stack_000004ef;
  ASTContext *in_stack_000004f0;
  ArgumentListSyntax *in_stack_000004f8;
  string_view in_stack_00000500;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> in_stack_00000510;
  SourceRange in_stack_000006d0;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_000006e0;
  RandSeqProductionSymbol *in_stack_fffffffffffffea8;
  ProdItem *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  SmallVectorBase<const_slang::ast::Expression_*> *__s;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffec4;
  Token *in_stack_fffffffffffffed0;
  SyntaxNode *in_stack_ffffffffffffff00;
  ASTContext *in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  SmallVectorBase<const_slang::ast::Expression_*> local_88 [2];
  SourceRange local_38;
  string_view local_28;
  RandSeqProductionSymbol *local_18;
  
  local_28 = parsing::Token::valueText
                       ((Token *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_38 = parsing::Token::range(in_stack_fffffffffffffed0);
  name._M_str = in_stack_ffffffffffffff68;
  name._M_len = in_stack_ffffffffffffff60;
  SVar1.endLoc = in_stack_ffffffffffffff58;
  SVar1.startLoc = in_stack_ffffffffffffff50;
  local_18 = findProduction(name,SVar1,in_stack_ffffffffffffff48);
  if (local_18 == (RandSeqProductionSymbol *)0x0) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x642250);
    args_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffec0;
    args_00._M_ptr = (pointer)in_stack_fffffffffffffeb8;
    args_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffec4;
    ProdItem::ProdItem(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,args_00);
  }
  else {
    SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x642280);
    SVar1 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff00);
    __s = local_88;
    uVar2 = 0;
    CallExpression::bindArgs
              (in_stack_000004f8,in_stack_00000510,in_stack_00000500,in_stack_000006d0,
               in_stack_000004f0,in_stack_000006e0,(bool)in_stack_000004ef);
    dst = ASTContext::getCompilation((ASTContext *)0x64235e);
    SmallVectorBase<const_slang::ast::Expression_*>::copy(local_88,(EVP_PKEY_CTX *)dst,src);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
    span<const_slang::ast::Expression_*,_18446744073709551615UL>
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffec4,uVar2),
               (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)__s);
    args_01._M_extent._M_extent_value._0_4_ = uVar2;
    args_01._M_ptr = (pointer)__s;
    args_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffec4;
    ProdItem::ProdItem((ProdItem *)SVar1.endLoc,(RandSeqProductionSymbol *)SVar1.startLoc,args_01);
    SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6423d7);
  }
  return in_RDI;
}

Assistant:

RandSeqProductionSymbol::ProdItem RandSeqProductionSymbol::createProdItem(
    const RsProdItemSyntax& syntax, const ASTContext& context) {

    auto symbol = findProduction(syntax.name.valueText(), syntax.name.range(), context);
    if (!symbol)
        return ProdItem(nullptr, {});

    SmallVector<const Expression*> args;
    CallExpression::bindArgs(syntax.argList, symbol->arguments, symbol->name, syntax.sourceRange(),
                             context, args, /* isBuiltInMethod */ false);

    return ProdItem(symbol, args.copy(context.getCompilation()));
}